

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_Boolean UA_Node_hasSubTypeOrInstances(UA_Node *node)

{
  ulong uVar1;
  UA_Boolean UVar2;
  UA_NodeId *n2;
  ulong uVar3;
  UA_ReferenceNode *n1;
  UA_Boolean UVar4;
  bool bVar5;
  undefined1 local_60 [8];
  UA_NodeId hasSubType;
  UA_NodeId hasTypeDefinition;
  
  UVar4 = false;
  local_60._0_2_ = 0;
  stack0xffffffffffffffa4 = 0x2d00000000;
  hasSubType.identifier._8_2_ = 0;
  stack0xffffffffffffffbc = 0x2800000000;
  uVar1 = node->referencesSize;
  if (uVar1 != 0) {
    n1 = node->references;
    UVar4 = true;
    uVar3 = 1;
    do {
      if (n1->isInverse == false) {
        n2 = (UA_NodeId *)local_60;
      }
      else {
        n2 = (UA_NodeId *)((long)&hasSubType.identifier + 8);
      }
      UVar2 = UA_NodeId_equal(&n1->referenceTypeId,n2);
      if (UVar2) {
        return UVar4;
      }
      UVar4 = uVar3 < uVar1;
      n1 = n1 + 1;
      bVar5 = uVar3 != uVar1;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return UVar4;
}

Assistant:

UA_Boolean
UA_Node_hasSubTypeOrInstances(const UA_Node *node) {
    const UA_NodeId hasSubType = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    const UA_NodeId hasTypeDefinition = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == false &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasSubType))
            return true;
        if(node->references[i].isInverse == true &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasTypeDefinition))
            return true;
    }
    return false;
}